

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::TopKLayerParams::MergePartialFromCodedStream
          (TopKLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  char cVar6;
  ulong uVar7;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001cf590;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001cf590:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar7 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar4 | uVar7;
    }
    uVar4 = (uint32)uVar7;
    if ((uVar7 & 0x100000000) == 0) {
LAB_001cf5b1:
      if (uVar4 == 0) {
        return true;
      }
      if ((uVar4 & 7) == 4) {
        return true;
      }
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
    }
    else {
      uVar5 = (uint)(uVar7 >> 3) & 0x1fffffff;
      cVar6 = (char)uVar7;
      if (uVar5 == 3) {
        if (cVar6 == '\x18') {
          bVar3 = google::protobuf::internal::WireFormatLite::
                  ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (input,&this->usebottomk_);
          goto LAB_001cf5c9;
        }
        goto LAB_001cf5b1;
      }
      if (uVar5 == 2) {
        if (cVar6 != '\x10') goto LAB_001cf5b1;
        bVar3 = google::protobuf::io::CodedInputStream::ReadVarint64(input,&this->k_);
      }
      else {
        if ((uVar5 != 1) || (cVar6 != '\b')) goto LAB_001cf5b1;
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input,&this->axis_);
      }
    }
LAB_001cf5c9:
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool TopKLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.TopKLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 axis = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &axis_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 K = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &k_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool useBottomK = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &usebottomk_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.TopKLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.TopKLayerParams)
  return false;
#undef DO_
}